

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  unsigned_short *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  unsigned_short *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  iVar4 = obj->CurLenW;
  if (iVar4 < pos) {
    __assert_fail("pos <= text_len",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                  ,0xcef,
                  "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                 );
  }
  uVar3 = obj->UserFlags;
  lVar5 = (long)new_text_len;
  iVar2 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar5);
  if ((uVar3 >> 0x12 & 1) == 0) {
    if ((obj->BufCapacityA <= obj->CurLenA + iVar2) || ((obj->TextW).Size <= new_text_len + iVar4))
    {
      return false;
    }
  }
  else {
    iVar8 = (obj->TextW).Size;
    if (iVar8 <= new_text_len + iVar4) {
      if (iVar8 <= iVar4) {
        __assert_fail("text_len < obj->TextW.Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_widgets.cpp"
                      ,0xcfa,
                      "bool ImStb::STB_TEXTEDIT_INSERTCHARS(ImGuiInputTextState *, int, const ImWchar *, int)"
                     );
      }
      uVar3 = 0x100;
      if (0x100 < (uint)new_text_len) {
        uVar3 = new_text_len;
      }
      if ((uint)(new_text_len * 4) < uVar3) {
        uVar3 = new_text_len * 4;
      }
      uVar7 = 0x20;
      if (7 < new_text_len) {
        uVar7 = uVar3;
      }
      iVar9 = uVar7 + iVar4 + 1;
      iVar8 = (obj->TextW).Capacity;
      if (iVar8 <= (int)(uVar7 + iVar4)) {
        if (iVar8 == 0) {
          iVar8 = 8;
        }
        else {
          iVar8 = iVar8 / 2 + iVar8;
        }
        if (iVar8 <= iVar9) {
          iVar8 = iVar9;
        }
        puVar6 = (unsigned_short *)ImGui::MemAlloc((long)iVar8 * 2);
        puVar1 = (obj->TextW).Data;
        if (puVar1 != (unsigned_short *)0x0) {
          memcpy(puVar6,puVar1,(long)(obj->TextW).Size * 2);
          ImGui::MemFree((obj->TextW).Data);
        }
        (obj->TextW).Data = puVar6;
        (obj->TextW).Capacity = iVar8;
      }
      (obj->TextW).Size = iVar9;
    }
  }
  puVar1 = (obj->TextW).Data;
  if (iVar4 - pos != 0) {
    puVar6 = puVar1 + pos;
    memmove(puVar6 + lVar5,puVar6,(long)(iVar4 - pos) * 2);
  }
  memcpy(puVar1 + pos,new_text,lVar5 * 2);
  lVar5 = obj->CurLenW + lVar5;
  iVar4 = (int)lVar5;
  obj->CurLenW = iVar4;
  obj->CurLenA = obj->CurLenA + iVar2;
  if (iVar4 < (obj->TextW).Size) {
    (obj->TextW).Data[lVar5] = 0;
    return true;
  }
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                ,0x52e,"T &ImVector<unsigned short>::operator[](int) [T = unsigned short]");
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}